

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

double OpenMD::doubleDot<double,3u,3u>
                 (RectMatrix<double,_3U,_3U> *t1,RectMatrix<double,_3U,_3U> *t2)

{
  RectMatrix<double,_3U,_3U> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  double dVar1;
  double dVar2;
  uint j;
  uint i;
  double tmp;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      dVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_1c,local_20);
      dVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_1c,local_20);
      local_18 = dVar1 * dVar2 + local_18;
    }
  }
  return local_18;
}

Assistant:

inline Real doubleDot(const RectMatrix<Real, Row, Col>& t1,
                        const RectMatrix<Real, Row, Col>& t2) {
    Real tmp;
    tmp = 0;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        tmp += t1(i, j) * t2(i, j);

    return tmp;
  }